

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskUtil.cpp
# Opt level: O2

vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_> *
DiffSectorCopies(vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
                 *__return_storage_ptr__,Sector *sector)

{
  pointer pDVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pDVar4;
  pointer pDVar5;
  int iVar6;
  int iVar7;
  DataList *pDVar8;
  ulong uVar9;
  pointer pDVar10;
  pointer puVar11;
  Data *data;
  pointer pDVar12;
  pointer puVar13;
  Data *data_1;
  pair<__gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,___gnu_cxx::__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  pVar14;
  pair<char,_unsigned_long> local_68;
  pointer local_58;
  pointer local_50;
  pointer local_48;
  Sector *local_40;
  ulong local_38;
  
  iVar6 = Sector::copies(sector);
  if (iVar6 < 1) {
    __assert_fail("sector.copies() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/DiskUtil.cpp"
                  ,0x2a0,"std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector &)");
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pDVar8 = Sector::datas(sector);
  pDVar12 = (pDVar8->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pDVar8 = Sector::datas(sector);
  pDVar1 = (pDVar8->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
  pDVar10 = pDVar12;
  pDVar4 = pDVar12;
  if (pDVar12 != pDVar1) {
    while (pDVar12 = pDVar10, pDVar10 = pDVar4 + 1, pDVar10 != pDVar1) {
      pDVar5 = pDVar4 + 1;
      pDVar4 = pDVar10;
      if (*(int *)&(pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start <=
          *(int *)&(pDVar5->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish -
          *(int *)&(pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start) {
        pDVar10 = pDVar12;
      }
    }
  }
  puVar13 = (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_50 = (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  uVar9 = 0;
  local_48 = pDVar12;
  local_40 = sector;
  while( true ) {
    iVar6 = (int)uVar9;
    if (local_50 <= puVar13) break;
    puVar2 = (local_48->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_58 = (pointer)(long)iVar6;
    local_38 = uVar9;
    pDVar8 = Sector::datas(local_40);
    puVar11 = local_50 + -(long)puVar13;
    pDVar1 = (pDVar8->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pDVar12 = (pDVar8->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
                   super__Vector_impl_data._M_start; pDVar12 != pDVar1; pDVar12 = pDVar12 + 1) {
      if (puVar11 == (pointer)0x0) {
        puVar11 = (pointer)0x0;
      }
      else {
        pVar14 = std::
                 __mismatch<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (puVar13,puVar13 + (long)puVar11,
                            puVar13 + ((long)(pDVar12->
                                             super_vector<unsigned_char,_std::allocator<unsigned_char>_>
                                             ).
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start -
                                      (long)puVar2));
        if ((long)(pVar14.first._M_current._M_current + -(long)puVar13) < (long)puVar11) {
          puVar11 = pVar14.first._M_current._M_current + -(long)puVar13;
        }
      }
    }
    iVar6 = (int)local_38;
    if ((0xf < (long)puVar11) || ((puVar3 = puVar11, puVar13 == puVar2 && (0 < (long)puVar11)))) {
      if (iVar6 != 0) {
        local_68.first = '-';
        local_68.second = (unsigned_long)local_58;
        std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
        emplace_back<std::pair<char,unsigned_long>>
                  ((vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
                    *)__return_storage_ptr__,&local_68);
      }
      local_68.first = '=';
      local_68.second = (unsigned_long)puVar11;
      std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
      emplace_back<std::pair<char,unsigned_long>>
                ((vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
                  *)__return_storage_ptr__,&local_68);
      local_58 = (pointer)0x0;
      iVar6 = 0;
      puVar3 = local_58;
    }
    local_58 = puVar3;
    puVar13 = puVar13 + (long)puVar11;
    puVar2 = (local_48->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pDVar8 = Sector::datas(local_40);
    puVar11 = local_50 + -(long)puVar13;
    pDVar1 = (pDVar8->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pDVar12 = (pDVar8->super__Vector_base<Data,_std::allocator<Data>_>)._M_impl.
                   super__Vector_impl_data._M_start; pDVar12 != pDVar1; pDVar12 = pDVar12 + 1) {
      if (puVar11 == (pointer)0x0) {
        puVar11 = (pointer)0x0;
      }
      else {
        puVar3 = (pDVar12->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pVar14 = std::
                 __mismatch<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                           (puVar13 + ((long)puVar3 - (long)puVar2),
                            puVar13 + ((long)puVar3 - (long)puVar2) + (long)puVar11 + -1,
                            puVar13 + (long)(puVar3 + (1 - (long)puVar2)));
        if ((long)(pVar14.first._M_current._M_current +
                  (1 - (long)(puVar13 +
                             ((long)(pDVar12->
                                    super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start - (long)puVar2)))) <
            (long)puVar11) {
          puVar11 = pVar14.first._M_current._M_current +
                    (1 - (long)(puVar13 +
                               ((long)(pDVar12->
                                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start - (long)puVar2)));
        }
      }
    }
    if ((long)puVar11 < 0x10) {
      iVar7 = (int)puVar11;
    }
    else {
      if (iVar6 != 0) {
        local_68.first = '-';
        local_68.second = (unsigned_long)iVar6;
        std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
        emplace_back<std::pair<char,unsigned_long>>
                  ((vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
                    *)__return_storage_ptr__,&local_68);
      }
      local_68.first = '+';
      local_68.second = (unsigned_long)puVar11;
      std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
      emplace_back<std::pair<char,unsigned_long>>
                ((vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
                  *)__return_storage_ptr__,&local_68);
      iVar7 = 0;
      iVar6 = 0;
    }
    puVar13 = puVar13 + (long)puVar11;
    uVar9 = (ulong)(uint)(iVar7 + (int)local_58 + iVar6);
  }
  if (iVar6 != 0) {
    local_68.first = '-';
    local_68.second = (long)iVar6;
    std::vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>::
    emplace_back<std::pair<char,unsigned_long>>
              ((vector<std::pair<char,unsigned_long>,std::allocator<std::pair<char,unsigned_long>>>
                *)__return_storage_ptr__,&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<char, size_t>> DiffSectorCopies(const Sector& sector)
{
    assert(sector.copies() > 0);
    std::vector<std::pair<char, size_t>> diffs;

    auto& smallest = *std::min_element(
        sector.datas().begin(), sector.datas().end(),
        [](const Data& d1, const Data& d2) {
            return d1.size() < d2.size();
        }
    );
    auto it = smallest.begin();
    auto itEnd = smallest.end();

    //  int extent = pt_->GetDataExtent(nSector_);  // ToDo
    auto change_count = 0;

    auto diff = 0;
    while (it < itEnd)
    {
        auto offset = std::distance(smallest.begin(), it);
        auto same = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (same)
            {
                // Find the prefix length where all data copies match
                auto pair = std::mismatch(it, it + same, data.begin() + offset);
                auto offset2 = std::distance(it, pair.first);
                same = std::min(same, offset2);
            }
        }
        it = it + same;

        // Show the matching block if big enough or if found
        // at the start of the data field. Other fragments will
        // be added to the diff block.
        if (same >= MIN_DIFF_BLOCK || (offset == 0 && same > 0))
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('=', same));
            same = 0;
        }

        offset = std::distance(smallest.begin(), it);
        auto match = std::distance(it, itEnd);

        for (const auto& data : sector.datas())
        {
            if (match)
            {
                // Find the prefix length where each copy has matching filler
                auto pair = std::mismatch(data.begin() + offset, data.begin() + offset + match - 1, data.begin() + offset + 1);
                auto offset2 = 1 + std::distance(data.begin() + offset, pair.first);
                match = std::min(match, offset2);
            }
        }
        it = it + match;

        // Show the filler block if big enough. Filler has matching
        // bytes in each copy, but a different value across copies.
        if (match >= MIN_DIFF_BLOCK)
        {
            if (diff)
            {
                ++change_count;
                diffs.push_back(std::make_pair('-', diff));
                diff = 0;
            }

            ++change_count;
            diffs.push_back(std::make_pair('+', match));
            match = 0;
        }

        diff += static_cast<int>(same + match);
    }

    if (diff)
    {
        ++change_count;
        diffs.push_back(std::make_pair('-', diff));
    }

    return diffs;
}